

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O2

void __thiscall wasm::Vacuum::visitFunction(Vacuum *this,Function *curr)

{
  bool bVar1;
  Nop *output;
  Expression *pEVar2;
  Signature SVar3;
  EffectAnalyzer local_198;
  
  pEVar2 = curr->body;
  SVar3 = HeapType::getSignature(&curr->type);
  pEVar2 = optimize(this,pEVar2,SVar3.results.id.id != 0,true);
  if (pEVar2 == (Expression *)0x0) {
    pEVar2 = curr->body;
    pEVar2->_id = NopId;
    (pEVar2->type).id = 0;
  }
  else {
    curr->body = pEVar2;
  }
  SVar3 = HeapType::getSignature(&curr->type);
  if (SVar3.results.id.id == 0) {
    EffectAnalyzer::EffectAnalyzer
              (&local_198,
               &((this->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,curr);
    bVar1 = EffectAnalyzer::hasUnremovableSideEffects(&local_198);
    EffectAnalyzer::~EffectAnalyzer(&local_198);
    if (!bVar1) {
      pEVar2 = curr->body;
      pEVar2->_id = NopId;
      (pEVar2->type).id = 0;
    }
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto* optimized =
      optimize(curr->body, curr->getResults() != Type::none, true);
    if (optimized) {
      curr->body = optimized;
    } else {
      ExpressionManipulator::nop(curr->body);
    }
    if (curr->getResults() == Type::none &&
        !EffectAnalyzer(getPassOptions(), *getModule(), curr)
           .hasUnremovableSideEffects()) {
      ExpressionManipulator::nop(curr->body);
    }
  }